

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O2

bool __thiscall duckdb::TypeInfo::operator==(TypeInfo *this,TypeInfo *other)

{
  __type _Var1;
  
  _Var1 = ::std::operator==(&this->alias,&other->alias);
  return _Var1 && this->type == other->type;
}

Assistant:

bool TypeInfo::operator==(const TypeInfo &other) const {
	return alias == other.alias && type == other.type;
}